

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::SwapCoordinates(ON_NurbsSurface *this,int i,int j)

{
  bool bVar1;
  uint uVar2;
  double *pdVar3;
  int iVar4;
  double *pdVar5;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  if (this->m_cv_count[1] < this->m_cv_count[0]) {
    if (0 < this->m_cv_count[1]) {
      pdVar5 = (double *)0x1;
      iVar4 = 0;
      do {
        uVar2 = this->m_cv_stride[1] * iVar4;
        pdVar3 = this->m_cv + uVar2;
        if ((int)uVar2 < 0) {
          pdVar3 = (double *)0x0;
        }
        if (this->m_cv == (double *)0x0) {
          pdVar3 = (double *)0x0;
        }
        bVar1 = ON_SwapPointListCoordinates(this->m_cv_count[0],this->m_cv_stride[0],pdVar3,i,j);
        if (!bVar1) {
          pdVar5 = (double *)0x0;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 < this->m_cv_count[1]);
      return SUB81(pdVar5,0);
    }
  }
  else if (0 < this->m_cv_count[0]) {
    pdVar5 = (double *)0x1;
    iVar4 = 0;
    do {
      uVar2 = this->m_cv_stride[0] * iVar4;
      pdVar3 = this->m_cv + uVar2;
      if ((int)uVar2 < 0) {
        pdVar3 = (double *)0x0;
      }
      if (this->m_cv == (double *)0x0) {
        pdVar3 = (double *)0x0;
      }
      bVar1 = ON_SwapPointListCoordinates(this->m_cv_count[1],this->m_cv_stride[1],pdVar3,i,j);
      if (!bVar1) {
        pdVar5 = (double *)0x0;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < this->m_cv_count[0]);
    return SUB81(pdVar5,0);
  }
  return true;
}

Assistant:

bool
ON_NurbsSurface::SwapCoordinates( int i, int j )
{
  DestroySurfaceTree();
  bool rc = true;
  int k;
  if ( m_cv_count[0] <= m_cv_count[1] ) {
    for ( k = 0; k < m_cv_count[0]; k++ ) {
      if ( !ON_SwapPointListCoordinates( m_cv_count[1], m_cv_stride[1], CV(k,0), i, j ) )
        rc = false;
    }
  }
  else {
    for ( k = 0; k < m_cv_count[1]; k++ ) {
      if ( !ON_SwapPointListCoordinates( m_cv_count[0], m_cv_stride[0], CV(0,k), i, j ) )
        rc = false;
    }
  }
  return rc;
}